

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *coScaleval,bool rowRatio)

{
  undefined1 (*pauVar1) [16];
  uint *puVar2;
  uint uVar3;
  int32_t iVar4;
  long lVar5;
  undefined8 uVar6;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Real a;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  undefined4 extraout_var;
  cpp_dec_float<50U,_int,_void> *extraout_RAX;
  undefined4 extraout_var_00;
  fpclass_type fVar11;
  soplex *psVar12;
  long lVar13;
  long lVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  long *plVar16;
  long in_FS_OFFSET;
  bool bVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mini;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_1f8 [48];
  undefined8 local_1c8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> *local_180;
  double local_178;
  soplex *local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  ulong local_e8;
  long local_e0;
  long local_d8;
  ulong local_d0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c8;
  long *local_c0;
  cpp_dec_float<50U,_int,_void> local_b8;
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [4];
  fpclass_type local_48;
  int32_t iStack_44;
  undefined8 uStack_40;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  local_180 = &__return_storage_ptr__->m_backend;
  local_c8 = lp;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  psVar12 = this + 0x100;
  if ((int)coScaleval != 0) {
    psVar12 = this + 0x38;
  }
  uVar3 = *(uint *)psVar12;
  pcVar10 = (cpp_dec_float<50U,_int,_void> *)(ulong)uVar3;
  if (0 < (int)uVar3) {
    local_178 = *(double *)(in_FS_OFFSET + -8);
    local_e8 = (ulong)uVar3;
    bVar17 = (char)coScaleval != '\0';
    local_d8 = 0xe8;
    if (bVar17) {
      local_d8 = 0x20;
    }
    local_e0 = 0xf0;
    if (bVar17) {
      local_e0 = 0x28;
    }
    local_d0 = 0;
    local_170 = this;
    do {
      plVar16 = (long *)((long)*(int *)(*(long *)(local_170 + local_e0) + 4 + local_d0 * 8) * 0x28 +
                        *(long *)(local_170 + local_d8));
      ::soplex::infinity::__tls_init();
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems[6] = 0;
      local_168.data._M_elems[7] = 0;
      local_168.data._M_elems._32_5_ = 0;
      local_168.data._M_elems[9]._1_3_ = 0;
      local_168.exp = 0;
      local_168.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_168,local_178);
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems._32_5_ = 0;
      local_128.data._M_elems[9]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_128,0.0);
      if (0 < *(int *)((long)plVar16 + 0xc)) {
        lVar13 = 0;
        lVar14 = 0;
        local_c0 = plVar16;
        do {
          lVar5 = *plVar16;
          local_1f8._40_4_ = *(int *)(lVar5 + 0x28 + lVar13);
          local_1f8[0x2c] = *(byte *)(lVar5 + 0x2c + lVar13);
          fVar11 = *(fpclass_type *)(lVar5 + 0x30 + lVar13);
          iVar4 = *(int32_t *)(lVar5 + 0x34 + lVar13);
          pauVar1 = (undefined1 (*) [16])(lVar5 + lVar13);
          puVar2 = (uint *)(lVar5 + 0x10 + lVar13);
          uVar7 = *(undefined8 *)puVar2;
          uVar8 = *(undefined8 *)(puVar2 + 2);
          uVar6 = *(undefined8 *)(lVar5 + 0x20 + lVar13);
          local_1f8._32_5_ = (undefined5)uVar6;
          local_1f8._37_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_1f8._16_4_ = (undefined4)uVar7;
          local_1f8._20_4_ = SUB84(uVar7,4);
          local_1f8._24_4_ = (undefined4)uVar8;
          local_1f8._28_4_ = (undefined4)((ulong)uVar8 >> 0x20);
          local_1c8 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar4,fVar11);
          if ((local_1f8[0x2c] == 1) &&
             (local_1f8._0_4_ = (undefined4)*(undefined8 *)*pauVar1,
             local_1f8._0_4_ != 0 || fVar11 != cpp_dec_float_finite)) {
            local_1f8[0x2c] = false;
          }
          pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                    ((local_c8->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._vptr_ClassArray + (ulong)*(uint *)(*plVar16 + 0x38 + lVar13) * 7);
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 10;
          local_1b8.data._M_elems[0] = 0;
          local_1b8.data._M_elems[1] = 0;
          local_1b8.data._M_elems[2] = 0;
          local_1b8.data._M_elems[3] = 0;
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems[6] = 0;
          local_1b8.data._M_elems[7] = 0;
          local_1b8.data._M_elems._32_5_ = 0;
          local_1b8.data._M_elems[9]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          pcVar10 = (cpp_dec_float<50U,_int,_void> *)local_1f8;
          if (&local_1b8 != pcVar15) {
            local_1b8.prec_elem = iVar4;
            local_1b8.fpclass = fVar11;
            pcVar10 = pcVar15;
            local_1b8.data._M_elems._0_8_ = *(undefined8 *)*pauVar1;
            local_1b8.data._M_elems._8_8_ = *(undefined8 *)(*pauVar1 + 8);
            local_1b8.data._M_elems._16_8_ = uVar7;
            local_1b8.data._M_elems[6] = local_1f8._24_4_;
            local_1b8.data._M_elems[7] = local_1f8._28_4_;
            local_1b8.data._M_elems._32_5_ = local_1f8._32_5_;
            local_1b8.data._M_elems[9]._1_3_ = local_1f8._37_3_;
            local_1b8.exp = local_1f8._40_4_;
            local_1b8.neg = (bool)local_1f8[0x2c];
          }
          local_1f8._0_16_ = *pauVar1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_1b8,pcVar10);
          bVar17 = local_1b8.neg;
          iVar9 = local_1b8.exp;
          local_58[1]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
          local_58._0_5_ = local_1b8.data._M_elems._32_5_;
          auStack_60[1] = local_1b8.data._M_elems[7];
          auStack_60[0] = local_1b8.data._M_elems[6];
          local_68[0] = local_1b8.data._M_elems[4];
          local_68[1] = local_1b8.data._M_elems[5];
          local_78[0] = local_1b8.data._M_elems[0];
          local_78[1] = local_1b8.data._M_elems[1];
          auStack_70[0] = local_1b8.data._M_elems[2];
          auStack_70[1] = local_1b8.data._M_elems[3];
          local_48 = local_1b8.fpclass;
          iStack_44 = local_1b8.prec_elem;
          uStack_40 = 0;
          this_00 = *(Tolerances **)(local_170 + 0x1e0);
          this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_170 + 0x1e8);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          a = Tolerances::epsilon(this_00);
          local_b8.data._M_elems[8] = local_58[0];
          local_b8.data._M_elems[9] = local_58[1];
          local_b8.data._M_elems[4] = local_68[0];
          local_b8.data._M_elems[5] = local_68[1];
          local_b8.data._M_elems[6] = auStack_60[0];
          local_b8.data._M_elems[7] = auStack_60[1];
          local_b8.data._M_elems[0] = local_78[0];
          local_b8.data._M_elems[1] = local_78[1];
          uVar6 = local_b8.data._M_elems._0_8_;
          local_b8.data._M_elems[2] = auStack_70[0];
          local_b8.data._M_elems[3] = auStack_70[1];
          local_b8.exp = iVar9;
          local_b8.neg = bVar17;
          local_b8.fpclass = local_48;
          local_b8.prec_elem = iStack_44;
          if ((bVar17 != false) &&
             (local_b8.data._M_elems[0] = local_78[0],
             local_b8.data._M_elems[0] != 0 || local_48 != cpp_dec_float_finite)) {
            local_b8.neg = (bool)(bVar17 ^ 1);
          }
          bVar17 = false;
          local_b8.data._M_elems._0_8_ = uVar6;
          if ((local_48 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_1c8 = (cpp_dec_float<50U,_int,_void> *)0xa00000000;
            local_1f8._0_16_ = (undefined1  [16])0x0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1f8._24_4_ = 0;
            local_1f8._28_4_ = 0;
            local_1f8._32_5_ = 0;
            local_1f8._37_3_ = 0;
            local_1f8._40_4_ = 0;
            local_1f8[0x2c] = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_1f8,a);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_b8,(cpp_dec_float<50U,_int,_void> *)local_1f8);
            bVar17 = iVar9 < 1;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          plVar16 = local_c0;
          if (!bVar17) {
            fVar11 = local_1b8.fpclass;
            if ((local_1b8.fpclass != cpp_dec_float_NaN) && (local_168.fpclass != cpp_dec_float_NaN)
               ) {
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1b8,&local_168);
              fVar11 = local_1b8.fpclass;
              if (iVar9 < 0) {
                local_168.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
                local_168.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
                local_168.data._M_elems[4] = local_1b8.data._M_elems[4];
                local_168.data._M_elems[5] = local_1b8.data._M_elems[5];
                local_168.data._M_elems[6] = local_1b8.data._M_elems[6];
                local_168.data._M_elems[7] = local_1b8.data._M_elems[7];
                local_168.data._M_elems[0] = local_1b8.data._M_elems[0];
                local_168.data._M_elems[1] = local_1b8.data._M_elems[1];
                local_168.data._M_elems[2] = local_1b8.data._M_elems[2];
                local_168.data._M_elems[3] = local_1b8.data._M_elems[3];
                local_168.exp = local_1b8.exp;
                local_168.neg = local_1b8.neg;
                local_168.fpclass = local_1b8.fpclass;
                local_168.prec_elem = local_1b8.prec_elem;
              }
            }
            if (((fVar11 != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1b8,&local_128), 0 < iVar9)) {
              local_128.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
              local_128.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
              local_128.data._M_elems[4] = local_1b8.data._M_elems[4];
              local_128.data._M_elems[5] = local_1b8.data._M_elems[5];
              local_128.data._M_elems[6] = local_1b8.data._M_elems[6];
              local_128.data._M_elems[7] = local_1b8.data._M_elems[7];
              local_128.data._M_elems[0] = local_1b8.data._M_elems[0];
              local_128.data._M_elems[1] = local_1b8.data._M_elems[1];
              local_128.data._M_elems[2] = local_1b8.data._M_elems[2];
              local_128.data._M_elems[3] = local_1b8.data._M_elems[3];
              local_128.exp = local_1b8.exp;
              local_128.neg = local_1b8.neg;
              local_128.fpclass = local_1b8.fpclass;
              local_128.prec_elem = local_1b8.prec_elem;
            }
          }
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 0x3c;
        } while (lVar14 < *(int *)((long)plVar16 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_1c8 = (cpp_dec_float<50U,_int,_void> *)0xa00000000;
      local_1f8._0_16_ = ZEXT816(0);
      local_1f8._16_4_ = 0;
      local_1f8._20_4_ = 0;
      local_1f8._24_4_ = 0;
      local_1f8._28_4_ = 0;
      local_1f8._32_5_ = 0;
      local_1f8._37_3_ = 0;
      local_1f8._40_4_ = 0;
      local_1f8[0x2c] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_1f8,local_178);
      if ((local_168.fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_1c8 == cpp_dec_float_NaN)
         ) {
LAB_00134138:
        local_1c8 = (cpp_dec_float<50U,_int,_void> *)0xa00000000;
        local_1f8._0_16_ = ZEXT816(0);
        local_1f8._16_4_ = 0;
        local_1f8._20_4_ = 0;
        local_1f8._24_4_ = 0;
        local_1f8._28_4_ = 0;
        local_1f8._32_5_ = 0;
        local_1f8._37_3_ = 0;
        local_1f8._40_4_ = 0;
        local_1f8[0x2c] = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_1f8,&local_128,&local_168);
        pcVar10 = extraout_RAX;
        if (((fpclass_type)local_1c8 != cpp_dec_float_NaN) &&
           (pcVar10 = local_180, local_180->fpclass != cpp_dec_float_NaN)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)local_1f8,local_180);
          pcVar10 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(extraout_var_00,iVar9);
          if (0 < iVar9) {
            *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_180->data)->data)._M_elems + 8) =
                 CONCAT35(local_1f8._37_3_,local_1f8._32_5_);
            (((cpp_dec_float<50U,_int,_void> *)&local_180->data)->data)._M_elems[4] =
                 local_1f8._16_4_;
            (((cpp_dec_float<50U,_int,_void> *)&local_180->data)->data)._M_elems[5] =
                 local_1f8._20_4_;
            (((cpp_dec_float<50U,_int,_void> *)&local_180->data)->data)._M_elems[6] =
                 local_1f8._24_4_;
            (((cpp_dec_float<50U,_int,_void> *)&local_180->data)->data)._M_elems[7] =
                 local_1f8._28_4_;
            *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_180->data)->data)._M_elems =
                 local_1f8._0_8_;
            *(undefined8 *)
             ((((cpp_dec_float<50U,_int,_void> *)&local_180->data)->data)._M_elems + 2) =
                 local_1f8._8_8_;
            local_180->exp = local_1f8._40_4_;
            local_180->neg = (bool)local_1f8[0x2c];
            *(cpp_dec_float<50U,_int,_void> **)&local_180->fpclass = local_1c8;
            pcVar10 = local_1c8;
          }
        }
      }
      else {
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_168,(cpp_dec_float<50U,_int,_void> *)local_1f8);
        pcVar10 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(extraout_var,iVar9);
        if (iVar9 != 0) goto LAB_00134138;
      }
      local_d0 = local_d0 + 1;
    } while (local_d0 != local_e8);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)pcVar10;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}